

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O1

dmr_C * new_dmr_C(void)

{
  dmr_C *C;
  
  C = (dmr_C *)calloc(1,0x3d38);
  C->standard = STANDARD_GNU89;
  C->arch_m64 = 1;
  C->arch_msize_long = 0;
  C->arch_big_endian = 0;
  C->gcc_base_dir = (char *)0x0;
  C->multiarch_dir = (char *)0x0;
  C->Waddress_space = 1;
  C->Wbitwise = 1;
  C->Wcast_truncate = 1;
  C->Wcontext = 1;
  C->Wdecl = 1;
  C->Wdeclarationafterstatement = -1;
  C->Wdesignated_init = 1;
  C->Wenum_mismatch = 1;
  C->Wuninitialized = 1;
  C->Wunknown_attribute = 1;
  C->Wvla = 1;
  C->Woverride_init = 1;
  C->Wmemcpy_max_count = 1;
  C->Wnon_pointer_null = 1;
  C->Wold_initializer = 1;
  C->Wone_bit_signed_bitfield = 1;
  C->max_warnings = 100;
  C->show_info = 1;
  C->fmemcpy_max_count = 100000;
  dmrC_allocator_init(&C->ptrlist_allocator,"ptrlist_nodes",0x108,8,0x8000);
  dmrC_allocator_init(&C->byte_allocator,"bytes",1,1,0x8000);
  dmrC_allocator_init(&C->ident_allocator,"identifiers",0x18,8,0x8000);
  dmrC_allocator_init(&C->string_allocator,"strings",4,4,0x8000);
  dmrC_allocator_init(&C->token_allocator,"tokens",0x18,8,0x8000);
  dmrC_allocator_init(&C->scope_allocator,"scopes",0x18,8,0x8000);
  dmrC_allocator_init(&C->expression_allocator,"expressions",0x40,0x10,0x8000);
  dmrC_allocator_init(&C->statement_allocator,"statements",0x50,8,0x8000);
  C->warnings[0].name = "address-space";
  C->warnings[0].flag = &C->Waddress_space;
  C->warnings[1].name = "bitwise";
  C->warnings[1].flag = &C->Wbitwise;
  C->warnings[2].name = "cast-to-as";
  C->warnings[2].flag = &C->Wcast_to_as;
  C->warnings[3].name = "cast-truncate";
  C->warnings[3].flag = &C->Wcast_truncate;
  C->warnings[4].name = "context";
  C->warnings[4].flag = &C->Wcontext;
  C->warnings[5].name = "decl";
  C->warnings[5].flag = &C->Wdecl;
  C->warnings[6].name = "declaration-after-statement";
  C->warnings[6].flag = &C->Wdeclarationafterstatement;
  C->warnings[7].name = "default-bitfield-sign";
  C->warnings[7].flag = &C->Wdefault_bitfield_sign;
  C->warnings[8].name = "designated-init";
  C->warnings[8].flag = &C->Wdesignated_init;
  C->warnings[9].name = "do-while";
  C->warnings[9].flag = &C->Wdo_while;
  C->warnings[10].name = "enum-mismatch";
  C->warnings[10].flag = &C->Wenum_mismatch;
  C->warnings[0xb].name = "sparse-error";
  C->warnings[0xb].flag = &C->Wsparse_error;
  C->warnings[0xc].name = "init-cstring";
  C->warnings[0xc].flag = &C->Winit_cstring;
  C->warnings[0xd].name = "non-pointer-null";
  C->warnings[0xd].flag = &C->Wnon_pointer_null;
  C->warnings[0xe].name = "old-initializer";
  C->warnings[0xe].flag = &C->Wold_initializer;
  C->warnings[0xf].name = "one-bit-signed-bitfield";
  C->warnings[0xf].flag = &C->Wone_bit_signed_bitfield;
  C->warnings[0x10].name = "paren-string";
  C->warnings[0x10].flag = &C->Wparen_string;
  C->warnings[0x11].name = "ptr-subtraction-blows";
  C->warnings[0x11].flag = &C->Wptr_subtraction_blows;
  C->warnings[0x12].name = "return-void";
  C->warnings[0x12].flag = &C->Wreturn_void;
  C->warnings[0x13].name = "shadow";
  C->warnings[0x13].flag = &C->Wshadow;
  C->warnings[0x14].name = "sizeof-bool";
  C->warnings[0x14].flag = &C->Wsizeof_bool;
  C->warnings[0x15].name = "tautological-compare";
  C->warnings[0x15].flag = &C->Wtautological_compare;
  C->warnings[0x16].name = "transparent-union";
  C->warnings[0x16].flag = &C->Wtransparent_union;
  C->warnings[0x17].name = "typesign";
  C->warnings[0x17].flag = &C->Wtypesign;
  C->warnings[0x18].name = "undef";
  C->warnings[0x18].flag = &C->Wundef;
  C->warnings[0x19].name = "uninitialized";
  C->warnings[0x19].flag = &C->Wuninitialized;
  C->warnings[0x1a].name = "unknown-attribute";
  C->warnings[0x1a].flag = &C->Wunknown_attribute;
  C->warnings[0x1b].name = "vla";
  C->warnings[0x1b].flag = &C->Wvla;
  C->warnings[0x1c].name = "address";
  C->warnings[0x1c].flag = &C->Waddress;
  C->warnings[0x1d].name = "memcpy-max-count";
  C->warnings[0x1d].flag = &C->Wmemcpy_max_count;
  C->warnings[0x1e].name = "override-init";
  C->warnings[0x1e].flag = &C->Woverride_init;
  C->warnings[0x1f].name = "override-init-all";
  C->warnings[0x1f].flag = &C->Woverride_init_all;
  C->debugs[0].name = "entry";
  C->debugs[0].flag = &C->dbg_entry;
  C->debugs[1].name = "dead";
  C->debugs[1].flag = &C->dbg_dead;
  C->dumps[0].name = "D";
  C->dumps[0].flag = &C->dump_macro_defs;
  dmrC_init_target(C);
  dmrC_init_tokenizer(C);
  dmrC_init_preprocessor_state(C);
  dmrC_init_scope(C);
  dmrC_init_symbols(C);
  dmrC_init_ctype(C);
  dmrC_init_linearizer(C);
  return C;
}

Assistant:

struct dmr_C *new_dmr_C()
{
	struct dmr_C *C = (struct dmr_C *)calloc(1, sizeof(struct dmr_C));
	C->standard = STANDARD_GNU89;
	C->arch_m64 = ARCH_M64_DEFAULT;
	C->arch_msize_long = 0;
	C->arch_big_endian = ARCH_BIG_ENDIAN;
#ifdef GCC_BASE
	C->gcc_base_dir = GCC_BASE;
#else
	C->gcc_base_dir = NULL;
#endif
#ifdef MULTIARCH_TRIPLET
	C->multiarch_dir = MULTIARCH_TRIPLET;
#else
	C->multiarch_dir = NULL;
#endif

	C->Waddress_space = 1;
	C->Wcast_truncate = 1;
	C->Wcontext = 1;
	C->Wdecl = 1;
	C->Wdeclarationafterstatement = -1;
	C->Wdesignated_init = 1;
	C->Wenum_mismatch = 1;
	C->Wnon_pointer_null = 1;
	C->Wold_initializer = 1;
	C->Wone_bit_signed_bitfield = 1;
	C->Wuninitialized = 1;
	C->Wunknown_attribute = 1;
	C->Wvla = 1;
	C->Woverride_init = 1;
	C->Wbitwise = 1;
	C->Wmemcpy_max_count = 1;

	C->max_warnings = 100;
	C->show_info = 1;
	C->fmemcpy_max_count = 100000;

	dmrC_allocator_init(&C->ptrlist_allocator, "ptrlist_nodes", sizeof(struct ptr_list),
		__alignof__(struct ptr_list), CHUNK);
	dmrC_allocator_init(&C->byte_allocator, "bytes", sizeof(char),
		       __alignof__(char), CHUNK);
	dmrC_allocator_init(&C->ident_allocator, "identifiers", sizeof(struct ident),
		       __alignof__(struct ident), CHUNK);
	dmrC_allocator_init(&C->string_allocator, "strings", sizeof(struct string),
		       __alignof__(struct string), CHUNK);
	dmrC_allocator_init(&C->token_allocator, "tokens", sizeof(struct token),
		       __alignof__(struct token), CHUNK);
	dmrC_allocator_init(&C->scope_allocator, "scopes", sizeof(struct scope),
		__alignof__(struct scope), CHUNK);
	dmrC_allocator_init(&C->expression_allocator, "expressions", sizeof(struct expression),
		__alignof__(struct expression), CHUNK);
	dmrC_allocator_init(&C->statement_allocator, "statements", sizeof(struct statement),
		__alignof__(struct statement), CHUNK);

	C->warnings[0].name = "address-space";		C->warnings[0].flag = &C->Waddress_space;
	C->warnings[1].name = "bitwise";			C->warnings[1].flag = &C->Wbitwise;
	C->warnings[2].name = "cast-to-as";			C->warnings[2].flag = &C->Wcast_to_as;
	C->warnings[3].name = "cast-truncate";		C->warnings[3].flag = &C->Wcast_truncate;
	C->warnings[4].name = "context";			C->warnings[4].flag = &C->Wcontext;
	C->warnings[5].name = "decl";				C->warnings[5].flag = &C->Wdecl;
	C->warnings[6].name = "declaration-after-statement"; C->warnings[6].flag = &C->Wdeclarationafterstatement;
	C->warnings[7].name = "default-bitfield-sign"; C->warnings[7].flag = &C->Wdefault_bitfield_sign;
	C->warnings[8].name = "designated-init";	C->warnings[8].flag = &C->Wdesignated_init;
	C->warnings[9].name = "do-while";			C->warnings[9].flag = &C->Wdo_while;
	C->warnings[10].name = "enum-mismatch";		C->warnings[10].flag = &C->Wenum_mismatch;
	C->warnings[11].name = "sparse-error";		C->warnings[11].flag = &C->Wsparse_error;
	C->warnings[12].name = "init-cstring";		C->warnings[12].flag = &C->Winit_cstring;
	C->warnings[13].name = "non-pointer-null";	C->warnings[13].flag = &C->Wnon_pointer_null;
	C->warnings[14].name = "old-initializer";	C->warnings[14].flag = &C->Wold_initializer;
	C->warnings[15].name = "one-bit-signed-bitfield"; C->warnings[15].flag = &C->Wone_bit_signed_bitfield;
	C->warnings[16].name = "paren-string";		C->warnings[16].flag = &C->Wparen_string;
	C->warnings[17].name = "ptr-subtraction-blows"; C->warnings[17].flag = &C->Wptr_subtraction_blows;
	C->warnings[18].name = "return-void";		C->warnings[18].flag = &C->Wreturn_void;
	C->warnings[19].name = "shadow";			C->warnings[19].flag = &C->Wshadow;
	C->warnings[20].name = "sizeof-bool";		C->warnings[20].flag = &C->Wsizeof_bool;
	C->warnings[21].name = "tautological-compare"; C->warnings[21].flag = &C->Wtautological_compare;
	C->warnings[22].name = "transparent-union"; C->warnings[22].flag = &C->Wtransparent_union;
	C->warnings[23].name = "typesign";			C->warnings[23].flag = &C->Wtypesign;
	C->warnings[24].name = "undef";				C->warnings[24].flag = &C->Wundef;
	C->warnings[25].name = "uninitialized";		C->warnings[25].flag = &C->Wuninitialized;
	C->warnings[26].name = "unknown-attribute"; C->warnings[26].flag = &C->Wunknown_attribute;
	C->warnings[27].name = "vla";				C->warnings[27].flag = &C->Wvla;
	C->warnings[28].name = "address";			C->warnings[28].flag = &C->Waddress;
	C->warnings[29].name = "memcpy-max-count";		C->warnings[29].flag = &C->Wmemcpy_max_count;
	C->warnings[30].name = "override-init";			C->warnings[30].flag = &C->Woverride_init;
	C->warnings[31].name = "override-init-all";		C->warnings[31].flag = &C->Woverride_init_all;

	C->debugs[0].name = "entry"; C->debugs[0].flag = &C->dbg_entry;
	C->debugs[1].name = "dead";  C->debugs[1].flag = &C->dbg_dead;

	C->dumps[0].name = "D"; C->dumps[0].flag = &C->dump_macro_defs;

	dmrC_init_target(C);
	dmrC_init_tokenizer(C);
	dmrC_init_preprocessor_state(C);
	dmrC_init_scope(C);
	dmrC_init_symbols(C);
	dmrC_init_ctype(C);
#if !defined(PARSER_ONLY)
	dmrC_init_linearizer(C);
#endif
	return C;
}